

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall
Mesh::Mesh(Mesh *this,vector<float,_std::allocator<float>_> *vertices,
          vector<float,_std::allocator<float>_> *normals,
          vector<float,_std::allocator<float>_> *texCoords,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices,int32_t positionLoc,
          int32_t normalLoc,int32_t texCoordLoc)

{
  VertexArray *this_00;
  BufferElement *pBVar1;
  BufferElement *pBVar2;
  element_type *peVar3;
  shared_ptr<IndexBuffer> ibo;
  shared_ptr<VertexBuffer> vboTexels;
  shared_ptr<VertexBuffer> vboNormals;
  shared_ptr<VertexBuffer> vboVertices;
  initializer_list<BufferElement> local_50;
  BufferElement local_3c;
  
  this->m_vertices = 0;
  this->m_indices = 0;
  this->m_positionLoc = positionLoc;
  this->m_normalLoc = normalLoc;
  this->m_texCoordLoc = texCoordLoc;
  this_00 = &this->m_vao;
  VertexArray::VertexArray(this_00);
  (this->m_indicesData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_indicesData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_indicesData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_verticesData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_verticesData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_verticesData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_drawMode = 4;
  vboNormals.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (vertices->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
       ._M_start;
  ibo.super___shared_ptr<IndexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((long)(vertices->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_finish -
       (long)vboNormals.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this->m_vertices =
       (uint32_t)
       ((ulong)((long)ibo.super___shared_ptr<IndexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr >> 2) /
       3);
  std::make_shared<VertexBuffer,unsigned_long,float_const*>
            ((unsigned_long *)&vboVertices,(float **)&ibo);
  vboNormals.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&vboTexels;
  vboTexels.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x3;
  vboTexels.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       vboTexels.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
       0xffffffffffffff00;
  vboNormals.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  BufferLayout::BufferLayout
            ((BufferLayout *)&ibo,(initializer_list<BufferElement> *)&vboNormals,false);
  BufferLayout::operator=
            (&(vboVertices.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_layout,(BufferLayout *)&ibo);
  std::_Vector_base<BufferElement,_std::allocator<BufferElement>_>::~_Vector_base
            ((_Vector_base<BufferElement,_std::allocator<BufferElement>_> *)&ibo);
  vboTexels.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  ibo.super___shared_ptr<IndexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((long)(normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_finish -
       (long)vboTexels.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::make_shared<VertexBuffer,unsigned_long,float_const*>
            ((unsigned_long *)&vboNormals,(float **)&ibo);
  peVar3 = vboNormals.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  vboTexels.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_50;
  local_50._M_array = (iterator)0x3;
  local_50._M_len = local_50._M_len & 0xffffffffffffff00;
  vboTexels.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  BufferLayout::BufferLayout
            ((BufferLayout *)&ibo,(initializer_list<BufferElement> *)&vboTexels,false);
  BufferLayout::operator=(&peVar3->m_layout,(BufferLayout *)&ibo);
  std::_Vector_base<BufferElement,_std::allocator<BufferElement>_>::~_Vector_base
            ((_Vector_base<BufferElement,_std::allocator<BufferElement>_> *)&ibo);
  local_50._M_array =
       (iterator)
       (texCoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_start;
  ibo.super___shared_ptr<IndexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((long)(texCoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)local_50._M_array);
  std::make_shared<VertexBuffer,unsigned_long,float_const*>
            ((unsigned_long *)&vboTexels,(float **)&ibo);
  peVar3 = vboTexels.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50._M_array = &local_3c;
  local_3c.type = Float2;
  local_3c.offset = 0;
  local_3c.normalized = false;
  local_50._M_len = 1;
  BufferLayout::BufferLayout((BufferLayout *)&ibo,&local_50,false);
  BufferLayout::operator=(&peVar3->m_layout,(BufferLayout *)&ibo);
  std::_Vector_base<BufferElement,_std::allocator<BufferElement>_>::~_Vector_base
            ((_Vector_base<BufferElement,_std::allocator<BufferElement>_> *)&ibo);
  VertexArray::add_vertex_buffer(this_00,&vboVertices,false);
  VertexArray::add_vertex_buffer(this_00,&vboNormals,false);
  VertexArray::add_vertex_buffer(this_00,&vboTexels,false);
  pBVar1 = (BufferElement *)
           (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar2 = (BufferElement *)
           (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar1 != pBVar2) {
    this->m_indices = (uint32_t)((ulong)((long)pBVar2 - (long)pBVar1) >> 2);
    local_50._M_array = pBVar1;
    std::make_shared<IndexBuffer,unsigned_int&,unsigned_int_const*>
              ((uint *)&ibo,(uint **)&this->m_indices);
    VertexArray::set_index_buffer(this_00,&ibo);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ibo.super___shared_ptr<IndexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vboTexels.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vboNormals.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vboVertices.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Mesh::Mesh(const std::vector<float>& vertices,
           const std::vector<float>& normals,
           const std::vector<float>& texCoords,
           const std::vector<uint32_t>& indices,
           int32_t positionLoc,
           int32_t normalLoc  ,
           int32_t texCoordLoc)
  : m_vertices(0),
    m_indices(0),
    m_positionLoc(positionLoc),
    m_normalLoc(normalLoc),
    m_texCoordLoc(texCoordLoc),
    m_drawMode(GL_TRIANGLES)
{
    // Assumes triangles as draw primitive
    m_vertices = vertices.size() / 3;

    // buffer for vertices
    // buffer for normals
    // buffer for texcoords

    auto vboVertices = std::make_shared<VertexBuffer>(
         vertices.size() * sizeof(float), vertices.data());
    vboVertices->set_layout(BufferLayout({{ElementType::Float3, "position"}}));

    auto vboNormals = std::make_shared<VertexBuffer>(
         normals.size() * sizeof(float), normals.data());
    vboNormals->set_layout(BufferLayout({{ElementType::Float3, "normal"}}));

    auto vboTexels = std::make_shared<VertexBuffer>(
        texCoords.size() * sizeof(float), texCoords.data());
    vboTexels->set_layout(BufferLayout({{ElementType::Float2, "texCoord"}}));
 
    m_vao.add_vertex_buffer(vboVertices);
    m_vao.add_vertex_buffer(vboNormals);
    m_vao.add_vertex_buffer(vboTexels);

    if (!indices.empty())
    {
        m_indices = indices.size();
        auto ibo = std::make_shared<IndexBuffer>(m_indices, indices.data());
        m_vao.set_index_buffer(ibo);
    }
}